

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O0

Expression * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::visit
          (ConvertComplexRemapTypes *this,Constant *c)

{
  Allocator *pAVar1;
  double dVar2;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *pAVar3;
  undefined8 uVar4;
  complex<float> cVar5;
  bool bVar6;
  Expression *pEVar7;
  ArraySize AVar8;
  Constant *pCVar9;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *pAVar10;
  Value *in_R8;
  float fVar11;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  ArrayView<soul::Value> elements_01;
  ArrayView<soul::Value> elements_02;
  bool local_fa9;
  Value local_fa8;
  pool_ref<soul::AST::Expression> local_f68;
  Value local_f60;
  pool_ref<soul::AST::Expression> local_f20;
  undefined1 local_f18 [8];
  complex<double> v_5;
  Value local_f00;
  pool_ref<soul::AST::Expression> local_ec0;
  Value local_eb8;
  pool_ref<soul::AST::Expression> local_e78;
  CommaSeparatedList *local_e70;
  CommaSeparatedList *item_1;
  undefined1 local_e28 [8];
  complex<double> v_4;
  size_t i_3;
  Value *local_e08;
  PrimitiveType local_dfc;
  undefined1 local_df8 [88];
  pool_ref<soul::AST::Expression> local_da0;
  ArrayView<soul::Value> local_d98;
  PrimitiveType local_d84;
  undefined1 local_d80 [88];
  pool_ref<soul::AST::Expression> local_d28;
  Value local_d20;
  Value local_ce0;
  Value local_ca0;
  undefined1 local_c60 [8];
  complex<double> v_3;
  size_t i_2;
  ArrayWithPreallocation<soul::Value,_8UL> imagValues_1;
  ArrayWithPreallocation<soul::Value,_8UL> realValues_1;
  pool_ref<soul::AST::Expression> local_7d8;
  Value local_7d0;
  pool_ref<soul::AST::Expression> local_790;
  complex<float> local_788;
  complex<float> v_2;
  Value local_778;
  pool_ref<soul::AST::Expression> local_738;
  Value local_730;
  pool_ref<soul::AST::Expression> local_6f0;
  CommaSeparatedList *local_6e8;
  CommaSeparatedList *item;
  complex<float> local_6a0;
  complex<float> v_1;
  size_t i_1;
  Value *local_688;
  PrimitiveType local_67c;
  undefined1 local_678 [88];
  pool_ref<soul::AST::Expression> local_620;
  ArrayView<soul::Value> local_618;
  PrimitiveType local_604;
  undefined1 local_600 [88];
  pool_ref<soul::AST::Expression> local_5a8;
  Value local_5a0;
  Value local_560;
  Value local_520;
  complex<float> local_4e0;
  complex<float> v;
  size_t i;
  ArrayWithPreallocation<soul::Value,_8UL> imagValues;
  ArrayWithPreallocation<soul::Value,_8UL> realValues;
  undefined1 local_88 [8];
  Type resultType;
  CommaSeparatedList *args;
  Type local_58;
  Expression *local_40;
  Expression *remappedType;
  Constant *local_20;
  Constant *c_local;
  ConvertComplexRemapTypes *this_local;
  
  local_20 = c;
  c_local = (Constant *)this;
  RewritingASTVisitor::visit(&this->super_RewritingASTVisitor,c);
  (*(local_20->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&remappedType);
  bVar6 = requiresRemapping((Type *)&remappedType);
  Type::~Type((Type *)&remappedType);
  if (bVar6) {
    pEVar7 = &local_20->super_Expression;
    (*(local_20->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])();
    pEVar7 = getRemappedType(this,&(pEVar7->super_Statement).super_ASTObject.context,&local_58);
    Type::~Type(&local_58);
    local_40 = pEVar7;
    resultType.structure.object =
         (Structure *)
         AST::Allocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                   (this->allocator,
                    &(local_20->super_Expression).super_Statement.super_ASTObject.context);
    (*(local_20->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_88);
    (*(local_20->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
              (realValues.space + 0x3f);
    bVar6 = Type::isComplex32((Type *)(realValues.space + 0x3f));
    Type::~Type((Type *)(realValues.space + 0x3f));
    if (bVar6) {
      bVar6 = Type::isVector((Type *)local_88);
      if (bVar6) {
        ArrayWithPreallocation<soul::Value,_8UL>::ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues.space + 0x3f));
        ArrayWithPreallocation<soul::Value,_8UL>::ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)&i);
        for (v._M_value = 0; cVar5._M_value = v._M_value,
            AVar8 = Type::getVectorSize((Type *)local_88), cVar5._M_value < AVar8;
            v._M_value = v._M_value + 1) {
          soul::Value::getSlice(&local_520,&local_20->value,v._M_value,v._M_value + 1);
          soul::Value::getAsComplex32(&local_520);
          soul::Value::~Value(&local_520);
          fVar11 = std::complex<float>::real_abi_cxx11_(&local_4e0);
          soul::Value::Value(&local_560,fVar11);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back
                    ((ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues.space + 0x3f),
                     &local_560);
          soul::Value::~Value(&local_560);
          fVar11 = std::complex<float>::imag_abi_cxx11_(&local_4e0);
          soul::Value::Value(&local_5a0,fVar11);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back
                    ((ArrayWithPreallocation<soul::Value,_8UL> *)&i,&local_5a0);
          soul::Value::~Value(&local_5a0);
        }
        pAVar3 = &(resultType.structure.object)->members;
        pAVar1 = this->allocator;
        pEVar7 = &local_20->super_Expression;
        PrimitiveType::PrimitiveType(&local_604,float32);
        AVar8 = Type::getVectorSize((Type *)local_88);
        Type::createVector((Type *)local_600,&local_604,AVar8);
        ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
                  (&local_618,(ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues.space + 0x3f))
        ;
        elements.e = in_R8;
        elements.s = local_618.e;
        soul::Value::createArrayOrVector
                  ((Value *)(local_600 + 0x18),(Value *)local_600,&(local_618.s)->type,elements);
        pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,
                            (Value *)(local_600 + 0x18));
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_5a8,pCVar9);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                   pAVar3->space,&local_5a8);
        pool_ref<soul::AST::Expression>::~pool_ref(&local_5a8);
        soul::Value::~Value((Value *)(local_600 + 0x18));
        Type::~Type((Type *)local_600);
        pAVar3 = &(resultType.structure.object)->members;
        pAVar1 = this->allocator;
        pEVar7 = &local_20->super_Expression;
        PrimitiveType::PrimitiveType(&local_67c,float32);
        AVar8 = Type::getVectorSize((Type *)local_88);
        Type::createVector((Type *)local_678,&local_67c,AVar8);
        ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
                  ((ArrayView<soul::Value> *)&i_1,(ArrayWithPreallocation<soul::Value,_8UL> *)&i);
        elements_00.e = in_R8;
        elements_00.s = local_688;
        soul::Value::createArrayOrVector
                  ((Value *)(local_678 + 0x18),(Value *)local_678,(Type *)i_1,elements_00);
        pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,
                            (Value *)(local_678 + 0x18));
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_620,pCVar9);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                   pAVar3->space,&local_620);
        pool_ref<soul::AST::Expression>::~pool_ref(&local_620);
        soul::Value::~Value((Value *)(local_678 + 0x18));
        Type::~Type((Type *)local_678);
        ArrayWithPreallocation<soul::Value,_8UL>::~ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)&i);
        ArrayWithPreallocation<soul::Value,_8UL>::~ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues.space + 0x3f));
      }
      else {
        bVar6 = Type::isArray((Type *)local_88);
        if (bVar6) {
          for (v_1._M_value = 0; cVar5._M_value = v_1._M_value,
              AVar8 = Type::getArraySize((Type *)local_88), cVar5._M_value < AVar8;
              v_1._M_value = v_1._M_value + 1) {
            soul::Value::getSlice((Value *)&item,&local_20->value,v_1._M_value,v_1._M_value + 1);
            soul::Value::getAsComplex32((Value *)&item);
            soul::Value::~Value((Value *)&item);
            local_6e8 = AST::Allocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                                  (this->allocator,
                                   &(local_20->super_Expression).super_Statement.super_ASTObject.
                                    context);
            pAVar10 = &local_6e8->items;
            pAVar1 = this->allocator;
            pEVar7 = &local_20->super_Expression;
            fVar11 = std::complex<float>::real_abi_cxx11_(&local_6a0);
            soul::Value::Value(&local_730,fVar11);
            pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                               (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,&local_730
                               );
            pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_6f0,pCVar9);
            ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                      (pAVar10,&local_6f0);
            pool_ref<soul::AST::Expression>::~pool_ref(&local_6f0);
            soul::Value::~Value(&local_730);
            pAVar10 = &local_6e8->items;
            pAVar1 = this->allocator;
            pEVar7 = &local_20->super_Expression;
            fVar11 = std::complex<float>::imag_abi_cxx11_(&local_6a0);
            soul::Value::Value(&local_778,fVar11);
            pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                               (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,&local_778
                               );
            pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_738,pCVar9);
            ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                      (pAVar10,&local_738);
            pool_ref<soul::AST::Expression>::~pool_ref(&local_738);
            soul::Value::~Value(&local_778);
            pAVar3 = &(resultType.structure.object)->members;
            pool_ref<soul::AST::Expression>::pool_ref<soul::AST::CommaSeparatedList,void>
                      ((pool_ref<soul::AST::Expression> *)&v_2,local_6e8);
            ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                       pAVar3->space,(pool_ref<soul::AST::Expression> *)&v_2);
            pool_ref<soul::AST::Expression>::~pool_ref((pool_ref<soul::AST::Expression> *)&v_2);
          }
        }
        else {
          soul::Value::getAsComplex32(&local_20->value);
          pAVar3 = &(resultType.structure.object)->members;
          pAVar1 = this->allocator;
          pEVar7 = &local_20->super_Expression;
          fVar11 = std::complex<float>::real_abi_cxx11_(&local_788);
          soul::Value::Value(&local_7d0,fVar11);
          pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,&local_7d0);
          pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_790,pCVar9);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     pAVar3->space,&local_790);
          pool_ref<soul::AST::Expression>::~pool_ref(&local_790);
          soul::Value::~Value(&local_7d0);
          pAVar3 = &(resultType.structure.object)->members;
          pAVar1 = this->allocator;
          pEVar7 = &local_20->super_Expression;
          fVar11 = std::complex<float>::imag_abi_cxx11_(&local_788);
          soul::Value::Value((Value *)(realValues_1.space + 0x3f),fVar11);
          pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,
                              (Value *)(realValues_1.space + 0x3f));
          pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_7d8,pCVar9);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     pAVar3->space,&local_7d8);
          pool_ref<soul::AST::Expression>::~pool_ref(&local_7d8);
          soul::Value::~Value((Value *)(realValues_1.space + 0x3f));
        }
      }
    }
    else {
      bVar6 = Type::isVector((Type *)local_88);
      if (bVar6) {
        ArrayWithPreallocation<soul::Value,_8UL>::ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues_1.space + 0x3f));
        ArrayWithPreallocation<soul::Value,_8UL>::ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_2);
        for (v_3._M_value._8_8_ = 0; uVar4 = v_3._M_value._8_8_,
            AVar8 = Type::getVectorSize((Type *)local_88), (ulong)uVar4 < AVar8;
            v_3._M_value._8_8_ = v_3._M_value._8_8_ + 1) {
          soul::Value::getSlice
                    (&local_ca0,&local_20->value,v_3._M_value._8_8_,v_3._M_value._8_8_ + 1);
          soul::Value::getAsComplex64(&local_ca0);
          soul::Value::~Value(&local_ca0);
          dVar2 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_c60);
          soul::Value::Value(&local_ce0,dVar2);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back
                    ((ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues_1.space + 0x3f),
                     &local_ce0);
          soul::Value::~Value(&local_ce0);
          dVar2 = std::complex<double>::imag_abi_cxx11_((complex<double> *)local_c60);
          soul::Value::Value(&local_d20,dVar2);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back
                    ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_2,&local_d20);
          soul::Value::~Value(&local_d20);
        }
        pAVar3 = &(resultType.structure.object)->members;
        pAVar1 = this->allocator;
        pEVar7 = &local_20->super_Expression;
        PrimitiveType::PrimitiveType(&local_d84,float64);
        AVar8 = Type::getVectorSize((Type *)local_88);
        Type::createVector((Type *)local_d80,&local_d84,AVar8);
        ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
                  (&local_d98,
                   (ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues_1.space + 0x3f));
        elements_01.e = in_R8;
        elements_01.s = local_d98.e;
        soul::Value::createArrayOrVector
                  ((Value *)(local_d80 + 0x18),(Value *)local_d80,&(local_d98.s)->type,elements_01);
        pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,
                            (Value *)(local_d80 + 0x18));
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_d28,pCVar9);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                   pAVar3->space,&local_d28);
        pool_ref<soul::AST::Expression>::~pool_ref(&local_d28);
        soul::Value::~Value((Value *)(local_d80 + 0x18));
        Type::~Type((Type *)local_d80);
        pAVar3 = &(resultType.structure.object)->members;
        pAVar1 = this->allocator;
        pEVar7 = &local_20->super_Expression;
        PrimitiveType::PrimitiveType(&local_dfc,float64);
        AVar8 = Type::getVectorSize((Type *)local_88);
        Type::createVector((Type *)local_df8,&local_dfc,AVar8);
        ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
                  ((ArrayView<soul::Value> *)&i_3,(ArrayWithPreallocation<soul::Value,_8UL> *)&i_2);
        elements_02.e = in_R8;
        elements_02.s = local_e08;
        soul::Value::createArrayOrVector
                  ((Value *)(local_df8 + 0x18),(Value *)local_df8,(Type *)i_3,elements_02);
        pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                           (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,
                            (Value *)(local_df8 + 0x18));
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_da0,pCVar9);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                   pAVar3->space,&local_da0);
        pool_ref<soul::AST::Expression>::~pool_ref(&local_da0);
        soul::Value::~Value((Value *)(local_df8 + 0x18));
        Type::~Type((Type *)local_df8);
        ArrayWithPreallocation<soul::Value,_8UL>::~ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)&i_2);
        ArrayWithPreallocation<soul::Value,_8UL>::~ArrayWithPreallocation
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)(imagValues_1.space + 0x3f));
      }
      else {
        bVar6 = Type::isArray((Type *)local_88);
        if (bVar6) {
          for (v_4._M_value._8_8_ = 0; uVar4 = v_4._M_value._8_8_,
              AVar8 = Type::getArraySize((Type *)local_88), (ulong)uVar4 < AVar8;
              v_4._M_value._8_8_ = v_4._M_value._8_8_ + 1) {
            soul::Value::getSlice
                      ((Value *)&item_1,&local_20->value,v_4._M_value._8_8_,v_4._M_value._8_8_ + 1);
            soul::Value::getAsComplex64((Value *)&item_1);
            soul::Value::~Value((Value *)&item_1);
            local_e70 = AST::Allocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                                  (this->allocator,
                                   &(local_20->super_Expression).super_Statement.super_ASTObject.
                                    context);
            pAVar10 = &local_e70->items;
            pAVar1 = this->allocator;
            pEVar7 = &local_20->super_Expression;
            dVar2 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_e28);
            soul::Value::Value(&local_eb8,dVar2);
            pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                               (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,&local_eb8
                               );
            pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_e78,pCVar9);
            ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                      (pAVar10,&local_e78);
            pool_ref<soul::AST::Expression>::~pool_ref(&local_e78);
            soul::Value::~Value(&local_eb8);
            pAVar10 = &local_e70->items;
            pAVar1 = this->allocator;
            pEVar7 = &local_20->super_Expression;
            dVar2 = std::complex<double>::imag_abi_cxx11_((complex<double> *)local_e28);
            soul::Value::Value(&local_f00,dVar2);
            pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                               (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,&local_f00
                               );
            pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_ec0,pCVar9);
            ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                      (pAVar10,&local_ec0);
            pool_ref<soul::AST::Expression>::~pool_ref(&local_ec0);
            soul::Value::~Value(&local_f00);
            pAVar3 = &(resultType.structure.object)->members;
            pool_ref<soul::AST::Expression>::pool_ref<soul::AST::CommaSeparatedList,void>
                      ((pool_ref<soul::AST::Expression> *)(v_5._M_value + 8),local_e70);
            ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                       pAVar3->space,(pool_ref<soul::AST::Expression> *)(v_5._M_value + 8));
            pool_ref<soul::AST::Expression>::~pool_ref
                      ((pool_ref<soul::AST::Expression> *)(v_5._M_value + 8));
          }
        }
        else {
          soul::Value::getAsComplex64(&local_20->value);
          pAVar3 = &(resultType.structure.object)->members;
          pAVar1 = this->allocator;
          pEVar7 = &local_20->super_Expression;
          dVar2 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_f18);
          soul::Value::Value(&local_f60,dVar2);
          pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,&local_f60);
          pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_f20,pCVar9);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     pAVar3->space,&local_f20);
          pool_ref<soul::AST::Expression>::~pool_ref(&local_f20);
          soul::Value::~Value(&local_f60);
          pAVar3 = &(resultType.structure.object)->members;
          pAVar1 = this->allocator;
          pEVar7 = &local_20->super_Expression;
          dVar2 = std::complex<double>::imag_abi_cxx11_((complex<double> *)local_f18);
          soul::Value::Value(&local_fa8,dVar2);
          pCVar9 = AST::Allocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                             (pAVar1,&(pEVar7->super_Statement).super_ASTObject.context,&local_fa8);
          pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Constant,void>(&local_f68,pCVar9);
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                     pAVar3->space,&local_f68);
          pool_ref<soul::AST::Expression>::~pool_ref(&local_f68);
          soul::Value::~Value(&local_fa8);
        }
      }
    }
    local_fa9 = false;
    this_local = (ConvertComplexRemapTypes *)
                 AST::Allocator::
                 allocate<soul::AST::CallOrCast,soul::AST::Expression&,soul::AST::CommaSeparatedList&,bool>
                           (this->allocator,local_40,
                            (CommaSeparatedList *)resultType.structure.object,&local_fa9);
    Type::~Type((Type *)local_88);
  }
  else {
    this_local = (ConvertComplexRemapTypes *)local_20;
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::Constant& c) override
        {
            super::visit (c);

            if (requiresRemapping (c.getResultType()))
            {
                auto& remappedType = getRemappedType (c.context, c.getResultType());
                auto& args = allocator.allocate<AST::CommaSeparatedList> (c.context);
                auto resultType = c.getResultType();

                if (c.getResultType().isComplex32())
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex32();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }
                else
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex64();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }

                return allocator.allocate<AST::CallOrCast> (remappedType, args, false);
            }

            return c;
        }